

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pass.h
# Opt level: O1

size_t __thiscall
trieste::PassDef::apply_special<false,false,true>(PassDef *this,Node *root,Match *match)

{
  Effect<Node> *pEVar1;
  Node *node;
  element_type *peVar2;
  long *plVar3;
  Effect<Node> *pEVar4;
  char cVar5;
  __normal_iterator<std::shared_ptr<trieste::NodeDef>_*,_std::vector<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>_>
  _Var6;
  long lVar7;
  _Base_ptr p_Var8;
  _Base_ptr p_Var9;
  ptrdiff_t pVar10;
  Effect<Node> *pEVar11;
  size_t sVar12;
  bool bVar13;
  iterator it;
  vector<std::pair<std::shared_ptr<trieste::NodeDef>_&,___gnu_cxx::__normal_iterator<std::shared_ptr<trieste::NodeDef>_*,_std::vector<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>_>_>,_std::allocator<std::pair<std::shared_ptr<trieste::NodeDef>_&,___gnu_cxx::__normal_iterator<std::shared_ptr<trieste::NodeDef>_*,_std::vector<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>_>_>_>_>
  path;
  iterator start;
  Node root_1;
  pair<std::shared_ptr<trieste::NodeDef>_&,___gnu_cxx::__normal_iterator<std::shared_ptr<trieste::NodeDef>_*,_std::vector<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>_>_>
  local_a8;
  size_t local_98;
  PassDef *local_90;
  pair<std::shared_ptr<trieste::NodeDef>_&,___gnu_cxx::__normal_iterator<std::shared_ptr<trieste::NodeDef>_*,_std::vector<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>_>_>
  *local_88;
  iterator iStack_80;
  pair<std::shared_ptr<trieste::NodeDef>_&,___gnu_cxx::__normal_iterator<std::shared_ptr<trieste::NodeDef>_*,_std::vector<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>_>_>
  *local_78;
  long local_68;
  _Base_ptr local_60;
  NodeIt local_58;
  element_type *local_50;
  long local_48;
  element_type *local_40;
  __weak_count<(__gnu_cxx::_Lock_policy)2> local_38;
  
  local_90 = this;
  std::__shared_ptr<trieste::NodeDef,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<trieste::NodeDef,void>
            ((__shared_ptr<trieste::NodeDef,(__gnu_cxx::_Lock_policy)2> *)&stack0xffffffffffffffc0,
             (__weak_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2> *)
             (root->super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>)._M_ptr);
  if ((((local_40->type_).def)->fl & 0x40) == 0) {
    local_88 = (pair<std::shared_ptr<trieste::NodeDef>_&,___gnu_cxx::__normal_iterator<std::shared_ptr<trieste::NodeDef>_*,_std::vector<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>_>_>
                *)0x0;
    iStack_80._M_current =
         (pair<std::shared_ptr<trieste::NodeDef>_&,___gnu_cxx::__normal_iterator<std::shared_ptr<trieste::NodeDef>_*,_std::vector<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>_>_>
          *)0x0;
    local_78 = (pair<std::shared_ptr<trieste::NodeDef>_&,___gnu_cxx::__normal_iterator<std::shared_ptr<trieste::NodeDef>_*,_std::vector<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>_>_>
                *)0x0;
    local_a8.second._M_current =
         (local_40->children).
         super__Vector_base<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>
         ._M_impl.super__Vector_impl_data._M_start;
    local_a8.first = (shared_ptr<trieste::NodeDef> *)&stack0xffffffffffffffc0;
    std::
    vector<std::pair<std::shared_ptr<trieste::NodeDef>&,__gnu_cxx::__normal_iterator<std::shared_ptr<trieste::NodeDef>*,std::vector<std::shared_ptr<trieste::NodeDef>,std::allocator<std::shared_ptr<trieste::NodeDef>>>>>,std::allocator<std::pair<std::shared_ptr<trieste::NodeDef>&,__gnu_cxx::__normal_iterator<std::shared_ptr<trieste::NodeDef>*,std::vector<std::shared_ptr<trieste::NodeDef>,std::allocator<std::shared_ptr<trieste::NodeDef>>>>>>>
    ::
    _M_realloc_insert<std::pair<std::shared_ptr<trieste::NodeDef>&,__gnu_cxx::__normal_iterator<std::shared_ptr<trieste::NodeDef>*,std::vector<std::shared_ptr<trieste::NodeDef>,std::allocator<std::shared_ptr<trieste::NodeDef>>>>>>
              ((vector<std::pair<std::shared_ptr<trieste::NodeDef>&,__gnu_cxx::__normal_iterator<std::shared_ptr<trieste::NodeDef>*,std::vector<std::shared_ptr<trieste::NodeDef>,std::allocator<std::shared_ptr<trieste::NodeDef>>>>>,std::allocator<std::pair<std::shared_ptr<trieste::NodeDef>&,__gnu_cxx::__normal_iterator<std::shared_ptr<trieste::NodeDef>*,std::vector<std::shared_ptr<trieste::NodeDef>,std::allocator<std::shared_ptr<trieste::NodeDef>>>>>>>
                *)&local_88,(iterator)0x0,&local_a8);
    if (local_88 == iStack_80._M_current) {
      local_98 = 0;
    }
    else {
      local_60 = &(local_90->post_)._M_t._M_impl.super__Rb_tree_header._M_header;
      local_98 = 0;
      do {
        node = iStack_80._M_current[-1].first;
        peVar2 = (element_type *)iStack_80._M_current[-1].second._M_current;
        if (peVar2 == (element_type *)
                      (((node->super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>).
                       _M_ptr)->children).
                      super__Vector_base<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish) {
          local_48 = *(long *)((long)(local_90->rule_map).map._M_elems +
                              (ulong)(((((node->
                                         super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>
                                         )._M_ptr)->type_).def)->default_map_id & 0xfffffff8));
          if ((*(char *)(local_48 + 0x418) == '\0') &&
             (local_a8.first =
                   (((node->super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
                    )->children).
                   super__Vector_base<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>
                   ._M_impl.super__Vector_impl_data._M_start,
             (element_type *)local_a8.first !=
             (element_type *)
             (((node->super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
             children).
             super__Vector_base<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>
             ._M_impl.super__Vector_impl_data._M_finish)) {
            local_68 = 0;
            do {
              local_58._M_current = local_a8.first;
              plVar3 = *(long **)(local_48 + 0x18 +
                                 (ulong)(((((((enable_shared_from_this<trieste::NodeDef> *)
                                             &(local_a8.first)->
                                              super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>
                                             )->_M_weak_this).
                                            super___weak_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>
                                           ._M_ptr)->type_).def)->default_map_id & 0xfffffff8));
              pEVar11 = (Effect<Node> *)*plVar3;
              pEVar4 = (Effect<Node> *)plVar3[1];
              if (pEVar11 == pEVar4) {
                pVar10 = -1;
              }
              else {
                pEVar11 = pEVar11 + 4;
                pVar10 = -1;
                do {
                  match->index = 0;
                  ((match->captures).
                   super__Vector_base<std::pair<bool,_std::map<trieste::Token,_std::pair<__gnu_cxx::__normal_iterator<std::shared_ptr<trieste::NodeDef>_*,_std::vector<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>_>,___gnu_cxx::__normal_iterator<std::shared_ptr<trieste::NodeDef>_*,_std::vector<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>_>_>,_std::less<trieste::Token>,_std::allocator<std::pair<const_trieste::Token,_std::pair<__gnu_cxx::__normal_iterator<std::shared_ptr<trieste::NodeDef>_*,_std::vector<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>_>,___gnu_cxx::__normal_iterator<std::shared_ptr<trieste::NodeDef>_*,_std::vector<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>_>_>_>_>_>_>,_std::allocator<std::pair<bool,_std::map<trieste::Token,_std::pair<__gnu_cxx::__normal_iterator<std::shared_ptr<trieste::NodeDef>_*,_std::vector<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>_>,___gnu_cxx::__normal_iterator<std::shared_ptr<trieste::NodeDef>_*,_std::vector<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>_>_>,_std::less<trieste::Token>,_std::allocator<std::pair<const_trieste::Token,_std::pair<__gnu_cxx::__normal_iterator<std::shared_ptr<trieste::NodeDef>_*,_std::vector<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>_>,___gnu_cxx::__normal_iterator<std::shared_ptr<trieste::NodeDef>_*,_std::vector<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>_>_>_>_>_>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start)->first = false;
                  plVar3 = *(long **)&pEVar11[-4].super__Function_base._M_functor;
                  cVar5 = (**(code **)(*plVar3 + 0x20))(plVar3,&local_a8,node,match);
                  if (cVar5 == '\0') {
LAB_001777dc:
                    local_a8.first = local_58._M_current;
                    bVar13 = false;
                  }
                  else {
                    local_50 = (element_type *)local_a8.first;
                    _Var6 = std::
                            __find_if<__gnu_cxx::__normal_iterator<std::shared_ptr<trieste::NodeDef>*,std::vector<std::shared_ptr<trieste::NodeDef>,std::allocator<std::shared_ptr<trieste::NodeDef>>>>,__gnu_cxx::__ops::_Iter_pred<trieste::range_contains_error(__gnu_cxx::__normal_iterator<std::shared_ptr<trieste::NodeDef>*,std::vector<std::shared_ptr<trieste::NodeDef>,std::allocator<std::shared_ptr<trieste::NodeDef>>>>,__gnu_cxx::__normal_iterator<std::shared_ptr<trieste::NodeDef>*,std::vector<std::shared_ptr<trieste::NodeDef>,std::allocator<std::shared_ptr<trieste::NodeDef>>>>)::_lambda(auto:1&)_1_>>
                                      (local_58._M_current);
                    if ((element_type *)_Var6._M_current != local_50) goto LAB_001777dc;
                    pVar10 = replace(local_90,match,pEVar11,&local_58,(NodeIt *)&local_a8,node);
                    if (pVar10 == -1) {
                      pVar10 = -1;
                      goto LAB_001777dc;
                    }
                    local_68 = local_68 + pVar10;
                    bVar13 = true;
                  }
                } while ((!bVar13) &&
                        (pEVar1 = pEVar11 + 1, pEVar11 = pEVar11 + 5, pEVar1 != pEVar4));
              }
              if (pVar10 == -1) {
                local_a8.first = (shared_ptr<trieste::NodeDef> *)((long)local_a8.first + 0x10);
              }
              else if ((local_90->direction_ & 4) == 0) {
                local_a8.first =
                     (((node->super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>).
                      _M_ptr)->children).
                     super__Vector_base<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
              }
              else {
                local_a8.first =
                     (shared_ptr<trieste::NodeDef> *)
                     ((enable_shared_from_this<trieste::NodeDef> *)
                      &(local_a8.first)->
                       super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2> + pVar10);
              }
            } while ((element_type *)local_a8.first !=
                     (element_type *)
                     (((node->super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>).
                      _M_ptr)->children).
                     super__Vector_base<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish);
          }
          else {
            local_68 = 0;
          }
          peVar2 = (node->super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
          p_Var8 = (local_90->post_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
          p_Var9 = local_60;
          if (p_Var8 != (_Base_ptr)0x0) {
            do {
              bVar13 = *(TokenDef **)(p_Var8 + 1) < (peVar2->type_).def;
              if (!bVar13) {
                p_Var9 = p_Var8;
              }
              p_Var8 = (&p_Var8->_M_left)[bVar13];
            } while (p_Var8 != (_Base_ptr)0x0);
          }
          p_Var8 = local_60;
          if ((p_Var9 != local_60) &&
             (p_Var8 = p_Var9, (peVar2->type_).def < *(TokenDef **)(p_Var9 + 1))) {
            p_Var8 = local_60;
          }
          sVar12 = local_68 + local_98;
          if (p_Var8 != local_60) {
            local_a8.second._M_current =
                 (shared_ptr<trieste::NodeDef> *)
                 (node->super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>).
                 _M_refcount._M_pi;
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a8.second._M_current !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              if (__libc_single_threaded == '\0') {
                LOCK();
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a8.second._M_current)->
                _M_use_count = ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                               local_a8.second._M_current)->_M_use_count + 1;
                UNLOCK();
              }
              else {
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a8.second._M_current)->
                _M_use_count = ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                               local_a8.second._M_current)->_M_use_count + 1;
              }
            }
            local_a8.first = (shared_ptr<trieste::NodeDef> *)peVar2;
            if (p_Var8[1]._M_right == (_Base_ptr)0x0) {
              std::__throw_bad_function_call();
            }
            lVar7 = (**(code **)(p_Var8 + 2))(&p_Var8[1]._M_parent,&local_a8);
            local_98 = lVar7 + sVar12;
            sVar12 = local_98;
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a8.second._M_current !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              CLI::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a8.second._M_current)
              ;
              sVar12 = local_98;
            }
          }
          local_98 = sVar12;
          iStack_80._M_current = iStack_80._M_current + -1;
        }
        else {
          iStack_80._M_current[-1].second._M_current =
               (shared_ptr<trieste::NodeDef> *)&peVar2->type_;
          if ((((((peVar2->super_enable_shared_from_this<trieste::NodeDef>)._M_weak_this.
                  super___weak_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->type_).def
               )->fl & 0x40) == 0) {
            local_a8.second._M_current =
                 *(shared_ptr<trieste::NodeDef> **)
                  &(((peVar2->super_enable_shared_from_this<trieste::NodeDef>)._M_weak_this.
                     super___weak_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                   children).
                   super__Vector_base<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>
                   ._M_impl;
            local_a8.first = (shared_ptr<trieste::NodeDef> *)peVar2;
            if (iStack_80._M_current == local_78) {
              std::
              vector<std::pair<std::shared_ptr<trieste::NodeDef>&,__gnu_cxx::__normal_iterator<std::shared_ptr<trieste::NodeDef>*,std::vector<std::shared_ptr<trieste::NodeDef>,std::allocator<std::shared_ptr<trieste::NodeDef>>>>>,std::allocator<std::pair<std::shared_ptr<trieste::NodeDef>&,__gnu_cxx::__normal_iterator<std::shared_ptr<trieste::NodeDef>*,std::vector<std::shared_ptr<trieste::NodeDef>,std::allocator<std::shared_ptr<trieste::NodeDef>>>>>>>
              ::
              _M_realloc_insert<std::pair<std::shared_ptr<trieste::NodeDef>&,__gnu_cxx::__normal_iterator<std::shared_ptr<trieste::NodeDef>*,std::vector<std::shared_ptr<trieste::NodeDef>,std::allocator<std::shared_ptr<trieste::NodeDef>>>>>>
                        ((vector<std::pair<std::shared_ptr<trieste::NodeDef>&,__gnu_cxx::__normal_iterator<std::shared_ptr<trieste::NodeDef>*,std::vector<std::shared_ptr<trieste::NodeDef>,std::allocator<std::shared_ptr<trieste::NodeDef>>>>>,std::allocator<std::pair<std::shared_ptr<trieste::NodeDef>&,__gnu_cxx::__normal_iterator<std::shared_ptr<trieste::NodeDef>*,std::vector<std::shared_ptr<trieste::NodeDef>,std::allocator<std::shared_ptr<trieste::NodeDef>>>>>>>
                          *)&local_88,iStack_80,&local_a8);
            }
            else {
              (iStack_80._M_current)->first = (shared_ptr<trieste::NodeDef> *)peVar2;
              ((iStack_80._M_current)->second)._M_current = local_a8.second._M_current;
              iStack_80._M_current = iStack_80._M_current + 1;
            }
          }
        }
      } while (local_88 != iStack_80._M_current);
    }
    sVar12 = local_98;
    if (local_88 !=
        (pair<std::shared_ptr<trieste::NodeDef>_&,___gnu_cxx::__normal_iterator<std::shared_ptr<trieste::NodeDef>_*,_std::vector<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>_>_>
         *)0x0) {
      operator_delete(local_88,(long)local_78 - (long)local_88);
      sVar12 = local_98;
    }
  }
  else {
    sVar12 = 0;
  }
  if (local_38._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    CLI::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_38._M_pi);
  }
  return sVar12;
}

Assistant:

size_t apply_special(Node root, Match& match)
    {
      size_t changes = 0;

      auto add = [&](Node& node) SNMALLOC_FAST_PATH_LAMBDA {
        // Don't examine Error or Lift nodes.
        if (node->type() & flag::internal)
          return false;

        if constexpr (Pre)
        {
          auto pre_f = pre_.find(node->type());
          if (pre_f != pre_.end())
            changes += pre_f->second(node);
        }
        if constexpr (Topdown)
          changes += match_children(node, match);

        return true;
      };

      auto remove = [&](Node& node) SNMALLOC_FAST_PATH_LAMBDA {
        if constexpr (!Topdown)
          changes += match_children(node, match);
        else
          snmalloc::UNUSED(node);
        if constexpr (Post)
        {
          auto post_f = post_.find(node->type());
          if (post_f != post_.end())
            changes += post_f->second(node);
        }
      };

      root->traverse(add, remove);

      return changes;
    }